

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

void __thiscall solitaire::graphics::SDLGraphicsSystem::quit(SDLGraphicsSystem *this)

{
  pointer pWVar1;
  SDLGraphicsSystem *this_local;
  
  std::
  vector<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
  ::clear(&this->textures);
  std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::reset
            (&this->renderer,(pointer)0x0);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::reset
            (&this->window,(pointer)0x0);
  if ((this->isSDLInitialized & 1U) != 0) {
    this->isSDLInitialized = false;
    pWVar1 = std::
             unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
             ::operator->(&this->sdl);
    (*pWVar1->_vptr_Wrapper[3])();
  }
  return;
}

Assistant:

void SDLGraphicsSystem::quit() {
    textures.clear();
    renderer.reset();
    window.reset();

    if (isSDLInitialized)
    {
        isSDLInitialized = false;
        sdl->quit();
    }
}